

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

bool ON_String::IsPossibleEncoding(Encoding encoding,char *buffer,int buffer_length)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  char *pcVar4;
  byte bVar5;
  ulong uVar6;
  int db_count;
  int iVar7;
  int i;
  uint uVar8;
  int iVar9;
  size_t slen;
  ulong uVar10;
  ON_Big5CodePoint big5_cp;
  undefined8 uStack_38;
  
  if (buffer != (char *)0x0 && Unknown < encoding) {
    uVar10 = (ulong)(uint)buffer_length;
    if (buffer_length == -1) {
      uVar10 = 0;
      do {
        if (buffer[uVar10] == '\0') goto LAB_005b784c;
        uVar10 = uVar10 + 1;
      } while (uVar10 != 0x7ffffffd);
      uVar10 = 0x7ffffffd;
    }
LAB_005b784c:
    iVar9 = (int)uVar10;
    if (iVar9 == 0) {
      return true;
    }
    if (-1 < iVar9) {
      switch(encoding) {
      case ASCII:
        if (-1 < *buffer) {
          uVar1 = 1;
          do {
            uVar6 = uVar1;
            if ((uVar10 & 0xffffffff) == uVar6) break;
            uVar1 = uVar6 + 1;
          } while (-1 < buffer[uVar6]);
          return (uVar10 & 0xffffffff) <= uVar6;
        }
        break;
      case UTF8:
      case SloppyUTF8:
        bVar2 = ON_IsUTF8Encoded(SUB81(buffer,0),(char *)(uVar10 & 0xffffffff),buffer_length);
        return bVar2;
      case BIG5andASCII:
        uVar10 = 0;
        iVar7 = 0;
        uStack_38 = in_RAX;
        do {
          iVar3 = 1;
          if (buffer[uVar10] < '\0') {
            if ((int)uVar10 + 2 <= iVar9) {
              uStack_38 = CONCAT26(ON_Big5CodePoint::Error.m_big5_code_point,(undefined6)uStack_38);
              pcVar4 = ON_Big5CodePoint::Decode
                                 (buffer + uVar10,2,false,false,
                                  (ON_Big5CodePoint *)((long)&uStack_38 + 6));
              if ((pcVar4 == buffer + uVar10 + 2) &&
                 (bVar2 = ON_Big5CodePoint::IsValid
                                    ((ON_Big5CodePoint *)((long)&uStack_38 + 6),false,false), bVar2)
                 ) {
                iVar7 = iVar7 + 1;
                iVar3 = 2;
                goto LAB_005b7924;
              }
            }
            bVar5 = 0;
            goto LAB_005b7932;
          }
LAB_005b7924:
          uVar8 = (int)uVar10 + iVar3;
          uVar10 = (ulong)uVar8;
        } while ((int)uVar8 < iVar9);
        bVar5 = 1;
LAB_005b7932:
        return (bool)(0 < iVar7 & bVar5);
      }
    }
  }
  return false;
}

Assistant:

bool ON_String::IsPossibleEncoding(
  ON_String::Encoding encoding,
  const char* buffer,
  int buffer_length
)
{
  // In practice, this is used to choose between BIG5 and UTF when parsing strings that
  // are names of components.
  // 
  // If you need something more clever like NOTPOAD++ encoding detection, then you need
  // to find a library that uses some sampling and linguistic analysis.
  if (ON_String::Encoding::Unset == encoding)
    return false;
  if (ON_String::Encoding::Unknown == encoding)
    return false;
  if (nullptr == buffer)
    return false;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (0 == buffer_length)
    return true;
  if (buffer_length < 0)
    return false;

  switch (encoding)
  {
  case ON_String::Encoding::ASCII:
    return ON_IsASCIIEncoded(buffer, buffer_length);
  case ON_String::Encoding::UTF8:
    return ON_IsUTF8Encoded(false, buffer, buffer_length);
  case ON_String::Encoding::BIG5andASCII:
    return ON_IsBig5Encoded(buffer, buffer_length);
  case ON_String::Encoding::SloppyUTF8:
    return ON_IsUTF8Encoded(false, buffer, buffer_length);
  default:
    break;
  }

  return false;
}